

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

void __thiscall
gl4cts::CopyImage::IncompleteTexTest::IncompleteTexTest(IncompleteTexTest *this,Context *context)

{
  bool bVar1;
  undefined1 local_2c [8];
  testCase test_case;
  GLenum tex_target;
  GLuint target;
  Context *context_local;
  IncompleteTexTest *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"incomplete_tex",
             "Test verifies if INVALID_OPERATION is generated when texture provided to CopySubImageData is incomplete"
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__IncompleteTexTest_0322e650;
  this->m_dst_buf_name = 0;
  this->m_dst_tex_name = 0;
  this->m_src_buf_name = 0;
  this->m_src_tex_name = 0;
  this->m_test_case_index = 0;
  std::
  vector<gl4cts::CopyImage::IncompleteTexTest::testCase,_std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>_>
  ::vector(&this->m_test_cases);
  for (test_case.m_expected_result = 0; test_case.m_expected_result < 0xb;
      test_case.m_expected_result = test_case.m_expected_result + 1) {
    local_2c._0_4_ = *(undefined4 *)(s_valid_targets + (ulong)test_case.m_expected_result * 4);
    local_2c[4] = false;
    local_2c[5] = false;
    test_case.m_tex_target = 0x502;
    test_case._4_4_ = local_2c._0_4_;
    bVar1 = Utils::isTargetMultilevel(local_2c._0_4_);
    if (bVar1) {
      std::
      vector<gl4cts::CopyImage::IncompleteTexTest::testCase,_std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>_>
      ::push_back(&this->m_test_cases,(value_type *)local_2c);
      local_2c[4] = true;
      local_2c[5] = false;
      std::
      vector<gl4cts::CopyImage::IncompleteTexTest::testCase,_std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>_>
      ::push_back(&this->m_test_cases,(value_type *)local_2c);
      local_2c[4] = false;
      local_2c[5] = true;
      std::
      vector<gl4cts::CopyImage::IncompleteTexTest::testCase,_std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>_>
      ::push_back(&this->m_test_cases,(value_type *)local_2c);
      local_2c[4] = true;
      local_2c[5] = true;
      test_case.m_tex_target = 0;
      std::
      vector<gl4cts::CopyImage::IncompleteTexTest::testCase,_std::allocator<gl4cts::CopyImage::IncompleteTexTest::testCase>_>
      ::push_back(&this->m_test_cases,(value_type *)local_2c);
    }
  }
  return;
}

Assistant:

IncompleteTexTest::IncompleteTexTest(deqp::Context& context)
	: TestCase(
		  context, "incomplete_tex",
		  "Test verifies if INVALID_OPERATION is generated when texture provided to CopySubImageData is incomplete")
	, m_dst_buf_name(0)
	, m_dst_tex_name(0)
	, m_src_buf_name(0)
	, m_src_tex_name(0)
	, m_test_case_index(0)
{
	for (GLuint target = 0; target < s_n_valid_targets; ++target)
	{
		const GLenum tex_target = s_valid_targets[target];
		testCase	 test_case  = { tex_target, false, false, GL_INVALID_OPERATION };

		/* Skip targets that are not multi level */
		if (false == Utils::isTargetMultilevel(tex_target))
		{
			continue;
		}

		m_test_cases.push_back(test_case);

		test_case.m_is_dst_complete = true;
		test_case.m_is_src_complete = false;
		m_test_cases.push_back(test_case);

		test_case.m_is_dst_complete = false;
		test_case.m_is_src_complete = true;
		m_test_cases.push_back(test_case);

		test_case.m_is_dst_complete = true;
		test_case.m_is_src_complete = true;
		test_case.m_expected_result = GL_NO_ERROR;
		m_test_cases.push_back(test_case);
	}
}